

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendmsg2.c
# Opt level: O2

objc_slot2 * objc_get_slot2(Class cls,SEL selector,uint64_t *version)

{
  uint32_t index;
  objc_slot2 *poVar1;
  dtable_t sarray;
  IMP p_Var2;
  
  if (version != (uint64_t *)0x0) {
    *version = objc_method_cache_version;
  }
  poVar1 = (objc_slot2 *)
           SparseArrayLookup((SparseArray *)cls->dtable,*(uint32_t *)&selector->field_0);
  if (poVar1 == (objc_slot2 *)0x0) {
    sarray = dtable_for_class(cls);
    if (sarray == uninstalled_dtable) {
      sarray = dtable_for_class(cls);
    }
    poVar1 = (objc_slot2 *)SparseArrayLookup(sarray,*(uint32_t *)&selector->field_0);
    if (poVar1 == (objc_slot2 *)0x0) {
      index = get_untyped_idx(selector);
      poVar1 = (objc_slot2 *)SparseArrayLookup(sarray,index);
      if (poVar1 == (objc_slot2 *)0x0) {
        poVar1 = (objc_slot2 *)0x0;
      }
      else {
        if (version != (uint64_t *)0x0) {
          *version = 0;
        }
        p_Var2 = call_mismatch_hook(cls,selector,poVar1);
        poVar1 = (objc_slot2 *)__tls_get_addr(&PTR_00129f50);
        poVar1->method = p_Var2;
      }
    }
  }
  return poVar1;
}

Assistant:

struct objc_slot2 *objc_get_slot2(Class cls, SEL selector, uint64_t *version)
{
#ifndef NO_SAFE_CACHING
	if (version)
	{
		*version = objc_method_cache_version;
	}
#endif
	struct objc_slot2 * result = objc_dtable_lookup(cls->dtable, selector->index);
	if (0 == result)
	{
		void *dtable = dtable_for_class(cls);
		/* Install the dtable if it hasn't already been initialized. */
		if (dtable == uninstalled_dtable)
		{
			dtable = dtable_for_class(cls);
			result = objc_dtable_lookup(dtable, selector->index);
		}
		else
		{
			// Check again incase another thread updated the dtable while we
			// weren't looking
			result = objc_dtable_lookup(dtable, selector->index);
		}
		if (NULL == result)
		{
			if ((result = objc_dtable_lookup(dtable, get_untyped_idx(selector))))
			{
#ifndef NO_SAFE_CACHING
				if (version)
				{
					*version = 0;
				}
#endif
				uncacheable_slot.imp = call_mismatch_hook(cls, selector, result);
				result = (struct objc_slot2*)&uncacheable_slot;
			}
		}
	}
	return result;
}